

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

bool __thiscall zmq::router_t::xhas_out(router_t *this)

{
  bool bVar1;
  
  if (this->_mandatory == true) {
    bVar1 = routing_socket_base_t::any_of_out_pipes<bool(*)(zmq::pipe_t_const&)>
                      (&this->super_routing_socket_base_t,check_pipe_hwm);
    return bVar1;
  }
  return true;
}

Assistant:

bool zmq::router_t::xhas_out ()
{
    //  In theory, ROUTER socket is always ready for writing (except when
    //  MANDATORY is set). Whether actual attempt to write succeeds depends
    //  on whitch pipe the message is going to be routed to.

    if (!_mandatory)
        return true;

    return any_of_out_pipes (check_pipe_hwm);
}